

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_certificate.cc
# Opt level: O2

bool __thiscall bssl::ParseKeyUsage(bssl *this,Input key_usage_tlv,BitString *key_usage)

{
  uchar *puVar1;
  bool bVar2;
  long *plVar3;
  size_t sVar4;
  Input input;
  optional<bssl::der::BitString> key_usage_internal;
  Parser parser;
  _Storage<bssl::der::BitString,_true> local_50;
  char local_38;
  Parser local_30;
  
  plVar3 = (long *)key_usage_tlv.data_.size_;
  input.data_.size_ = (size_t)key_usage_tlv.data_.data_;
  input.data_.data_ = (uchar *)this;
  der::Parser::Parser(&local_30,input);
  der::Parser::ReadBitString((optional<bssl::der::BitString> *)&local_50._M_value,&local_30);
  if ((local_38 == '\x01') && (bVar2 = der::Parser::HasMore(&local_30), !bVar2)) {
    if (local_38 == '\0') {
      ::std::__throw_bad_optional_access();
    }
    sVar4 = 0;
    while (local_50._M_value.bytes_.data_.size_ != sVar4) {
      puVar1 = local_50._M_value.bytes_.data_.data_ + sVar4;
      sVar4 = sVar4 + 1;
      if (*puVar1 != '\0') {
        *(uint8_t *)(plVar3 + 2) = local_50._M_value.unused_bits_;
        *plVar3 = (long)local_50._M_value.bytes_.data_.data_;
        plVar3[1] = local_50._M_value.bytes_.data_.size_;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ParseKeyUsage(der::Input key_usage_tlv, der::BitString *key_usage) {
  der::Parser parser(key_usage_tlv);
  std::optional<der::BitString> key_usage_internal = parser.ReadBitString();
  if (!key_usage_internal) {
    return false;
  }

  // By definition the input was a single BIT STRING.
  if (parser.HasMore()) {
    return false;
  }

  // RFC 5280 section 4.2.1.3:
  //
  //     When the keyUsage extension appears in a certificate, at least
  //     one of the bits MUST be set to 1.
  if (BitStringIsAllZeros(key_usage_internal.value())) {
    return false;
  }

  *key_usage = key_usage_internal.value();
  return true;
}